

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2max_distance_targets.cc
# Opt level: O1

bool __thiscall
S2MaxDistanceCellTarget::UpdateMinDistance
          (S2MaxDistanceCellTarget *this,S2Point *v0,S2Point *v1,S2MaxDistance *min_dist)

{
  double dVar1;
  S1ChordAngle SVar2;
  
  SVar2 = S2Cell::GetMaxDistance(&this->cell_,v0,v1);
  dVar1 = (min_dist->distance_).length2_;
  if (dVar1 < SVar2.length2_) {
    (min_dist->distance_).length2_ = SVar2.length2_;
  }
  return dVar1 < SVar2.length2_;
}

Assistant:

bool S2MaxDistanceCellTarget::UpdateMinDistance(
    const S2Point& v0, const S2Point& v1, S2MaxDistance* min_dist) {
  return min_dist->UpdateMin(S2MaxDistance(cell_.GetMaxDistance(v0, v1)));
}